

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

BayesianProbitRegressor_FeatureWeight *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>(Arena *arena)

{
  BayesianProbitRegressor_FeatureWeight *pBVar1;
  
  if (arena != (Arena *)0x0) {
    pBVar1 = DoCreateMessage<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>(arena);
    return pBVar1;
  }
  pBVar1 = (BayesianProbitRegressor_FeatureWeight *)operator_new(0x30);
  CoreML::Specification::BayesianProbitRegressor_FeatureWeight::
  BayesianProbitRegressor_FeatureWeight(pBVar1,(Arena *)0x0,false);
  return pBVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }